

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack-utils.cpp
# Opt level: O2

void __thiscall wasm::StackSignature::StackSignature(StackSignature *this,Expression *expr)

{
  uintptr_t uVar1;
  pointer __position;
  Expression **ppEVar2;
  uintptr_t uVar3;
  AbstractChildIterator<wasm::ValueChildIterator> *pAVar4;
  Type *this_00;
  Iterator IVar5;
  Iterator __last;
  Iterator __first;
  AbstractChildIterator<wasm::ValueChildIterator> local_a8;
  StackSignature *local_68;
  Expression *local_60;
  undefined1 auStack_58 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> inputs;
  Index local_38;
  
  (this->params).id = 0;
  (this->results).id = 0;
  auStack_58 = (undefined1  [8])0x0;
  inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_68 = this;
  local_60 = expr;
  AbstractChildIterator<wasm::ValueChildIterator>::AbstractChildIterator(&local_a8,expr);
  local_38 = 0;
  inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)&local_a8;
  IVar5 = AbstractChildIterator<wasm::ValueChildIterator>::end(&local_a8);
  pAVar4 = &local_a8;
  while ((local_38 != IVar5.index || (pAVar4 != IVar5.parent))) {
    ppEVar2 = AbstractChildIterator<wasm::ValueChildIterator>::Iterator::operator*
                        ((Iterator *)
                         &inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage);
    __position = inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start;
    if (((*ppEVar2)->type).id < 2) {
      __assert_fail("child->type.isConcrete()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/stack-utils.cpp"
                    ,0x3e,"wasm::StackSignature::StackSignature(Expression *)");
    }
    this_00 = &(*ppEVar2)->type;
    __last = wasm::Type::end(this_00);
    __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
    __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = this_00;
    std::vector<wasm::Type,std::allocator<wasm::Type>>::insert<wasm::Type::Iterator,void>
              ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_58,
               (const_iterator)__position,__first,__last);
    local_38 = local_38 + 1;
    pAVar4 = (AbstractChildIterator<wasm::ValueChildIterator> *)
             inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
            (&local_a8.children.flexible.
              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>);
  wasm::Type::Type((Type *)&local_a8,(Tuple *)auStack_58);
  (local_68->params).id = local_a8.children.usedFixed;
  uVar1 = (local_60->type).id;
  uVar3 = 0;
  if (uVar1 != 1) {
    uVar3 = uVar1;
  }
  local_68->kind = (uint)(uVar1 == 1);
  (local_68->results).id = uVar3;
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
            ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58);
  return;
}

Assistant:

StackSignature::StackSignature(Expression* expr) {
  std::vector<Type> inputs;
  for (auto* child : ValueChildIterator(expr)) {
    assert(child->type.isConcrete());
    // Children might be tuple pops, so expand their types
    inputs.insert(inputs.end(), child->type.begin(), child->type.end());
  }
  params = Type(inputs);
  if (expr->type == Type::unreachable) {
    kind = Polymorphic;
    results = Type::none;
  } else {
    kind = Fixed;
    results = expr->type;
  }
}